

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# SyntaxClone.cpp
# Opt level: O0

int slang::syntax::deep::clone(__fn *__fn,void *__child_stack,int __flags,void *__arg,...)

{
  DefaultRsCaseItemSyntax *pDVar1;
  Token *unaff_retaddr;
  Token *in_stack_00000008;
  BumpAllocator *in_stack_00000010;
  BumpAllocator *in_stack_000000f8;
  Token *in_stack_00000100;
  BumpAllocator *in_stack_ffffffffffffffa8;
  Token *args_3;
  
  args_3 = (Token *)__child_stack;
  parsing::Token::deepClone(in_stack_00000100,in_stack_000000f8);
  parsing::Token::deepClone(in_stack_00000100,in_stack_000000f8);
  not_null<slang::syntax::RsProdItemSyntax_*>::operator*
            ((not_null<slang::syntax::RsProdItemSyntax_*> *)0x771fd0);
  deepClone<slang::syntax::RsProdItemSyntax>
            ((RsProdItemSyntax *)__child_stack,in_stack_ffffffffffffffa8);
  parsing::Token::deepClone(in_stack_00000100,in_stack_000000f8);
  pDVar1 = BumpAllocator::
           emplace<slang::syntax::DefaultRsCaseItemSyntax,slang::parsing::Token,slang::parsing::Token,slang::syntax::RsProdItemSyntax&,slang::parsing::Token>
                     (in_stack_00000010,in_stack_00000008,unaff_retaddr,(RsProdItemSyntax *)__fn,
                      args_3);
  return (int)pDVar1;
}

Assistant:

static SyntaxNode* clone(const DefaultRsCaseItemSyntax& node, BumpAllocator& alloc) {
    return alloc.emplace<DefaultRsCaseItemSyntax>(
        node.defaultKeyword.deepClone(alloc),
        node.colon.deepClone(alloc),
        *deepClone<RsProdItemSyntax>(*node.item, alloc),
        node.semi.deepClone(alloc)
    );
}